

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_impl.h
# Opt level: O3

void __thiscall AddrInfo::AddrInfo(AddrInfo *this,CAddress *addrIn,CNetAddr *addrSource)

{
  long lVar1;
  ServiceFlags SVar2;
  uint32_t uVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)this,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)addrIn);
  uVar3 = (addrIn->super_CService).super_CNetAddr.m_scope_id;
  (this->super_CAddress).super_CService.super_CNetAddr.m_net =
       (addrIn->super_CService).super_CNetAddr.m_net;
  (this->super_CAddress).super_CService.super_CNetAddr.m_scope_id = uVar3;
  (this->super_CAddress).super_CService.port = (addrIn->super_CService).port;
  SVar2 = addrIn->nServices;
  (this->super_CAddress).nTime.__d.__r = (addrIn->nTime).__d.__r;
  (this->super_CAddress).nServices = SVar2;
  (this->m_last_try).__d.__r = 0;
  (this->m_last_count_attempt).__d.__r = 0;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            (&(this->source).m_addr,&addrSource->m_addr);
  uVar3 = addrSource->m_scope_id;
  (this->source).m_net = addrSource->m_net;
  (this->source).m_scope_id = uVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    (this->m_last_success).__d.__r = 0;
    this->nAttempts = 0;
    this->nRefCount = 0;
    this->fInTried = false;
    this->nRandomPos = -1;
    return;
  }
  __stack_chk_fail();
}

Assistant:

AddrInfo(const CAddress &addrIn, const CNetAddr &addrSource) : CAddress(addrIn), source(addrSource)
    {
    }